

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# world.c
# Opt level: O0

void ecs_set_component_actions_w_entity
               (ecs_world_t *world,ecs_entity_t component,EcsComponentLifecycle *lifecycle)

{
  ecs_table_event_t local_50;
  ecs_c_info_t *local_30;
  ecs_c_info_t *c_info;
  EcsComponent *component_ptr;
  EcsComponentLifecycle *lifecycle_local;
  ecs_entity_t component_local;
  ecs_world_t *world_local;
  
  component_ptr = (EcsComponent *)lifecycle;
  lifecycle_local = (EcsComponentLifecycle *)component;
  component_local = (ecs_entity_t)world;
  c_info = (ecs_c_info_t *)ecs_get_w_entity(world,component,1);
  _ecs_assert(c_info != (ecs_c_info_t *)0x0,2,(char *)0x0,"component_ptr != NULL",
              "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/world.c"
              ,0x166);
  if (c_info == (ecs_c_info_t *)0x0) {
    __assert_fail("component_ptr != ((void*)0)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/world.c"
                  ,0x166,
                  "void ecs_set_component_actions_w_entity(ecs_world_t *, ecs_entity_t, EcsComponentLifecycle *)"
                 );
  }
  _ecs_assert((int)c_info->component != 0,2,(char *)0x0,"component_ptr->size != 0",
              "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/world.c"
              ,0x169);
  if ((int)c_info->component == 0) {
    __assert_fail("component_ptr->size != 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/world.c"
                  ,0x169,
                  "void ecs_set_component_actions_w_entity(ecs_world_t *, ecs_entity_t, EcsComponentLifecycle *)"
                 );
  }
  local_30 = ecs_get_or_create_c_info((ecs_world_t *)component_local,(ecs_entity_t)lifecycle_local);
  _ecs_assert(local_30 != (ecs_c_info_t *)0x0,0xc,(char *)0x0,"c_info != NULL",
              "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/world.c"
              ,0x16d);
  if (local_30 == (ecs_c_info_t *)0x0) {
    __assert_fail("c_info != ((void*)0)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/world.c"
                  ,0x16d,
                  "void ecs_set_component_actions_w_entity(ecs_world_t *, ecs_entity_t, EcsComponentLifecycle *)"
                 );
  }
  if ((local_30->lifecycle_set & 1U) == 0) {
    local_30->component = (ecs_entity_t)lifecycle_local;
    memcpy(&local_30->lifecycle,component_ptr,0x28);
    local_30->lifecycle_set = true;
    if ((*component_ptr == (EcsComponent)0x0) &&
       (((component_ptr[1] != (EcsComponent)0x0 || (component_ptr[2] != (EcsComponent)0x0)) ||
        (component_ptr[3] != (EcsComponent)0x0)))) {
      (local_30->lifecycle).ctor = ctor_init_zero;
    }
    local_50.kind = EcsTableComponentInfo;
    local_50.query = (ecs_query_t *)0x0;
    local_50.matched_table_index = 0;
    local_50.component = (ecs_entity_t)lifecycle_local;
    ecs_notify_tables((ecs_world_t *)component_local,&local_50);
  }
  else {
    _ecs_assert((EcsComponentLifecycle *)local_30->component == lifecycle_local,0xc,(char *)0x0,
                "c_info->component == component",
                "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/world.c"
                ,0x170);
    if ((EcsComponentLifecycle *)local_30->component != lifecycle_local) {
      __assert_fail("c_info->component == component",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/world.c"
                    ,0x170,
                    "void ecs_set_component_actions_w_entity(ecs_world_t *, ecs_entity_t, EcsComponentLifecycle *)"
                   );
    }
    _ecs_assert((EcsComponent)(local_30->lifecycle).ctor == *component_ptr,0x31,(char *)0x0,
                "c_info->lifecycle.ctor == lifecycle->ctor",
                "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/world.c"
                ,0x172);
    if ((EcsComponent)(local_30->lifecycle).ctor != *component_ptr) {
      __assert_fail("c_info->lifecycle.ctor == lifecycle->ctor",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/world.c"
                    ,0x172,
                    "void ecs_set_component_actions_w_entity(ecs_world_t *, ecs_entity_t, EcsComponentLifecycle *)"
                   );
    }
    _ecs_assert((EcsComponent)(local_30->lifecycle).dtor == component_ptr[1],0x31,(char *)0x0,
                "c_info->lifecycle.dtor == lifecycle->dtor",
                "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/world.c"
                ,0x174);
    if ((EcsComponent)(local_30->lifecycle).dtor != component_ptr[1]) {
      __assert_fail("c_info->lifecycle.dtor == lifecycle->dtor",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/world.c"
                    ,0x174,
                    "void ecs_set_component_actions_w_entity(ecs_world_t *, ecs_entity_t, EcsComponentLifecycle *)"
                   );
    }
    _ecs_assert((EcsComponent)(local_30->lifecycle).copy == component_ptr[2],0x31,(char *)0x0,
                "c_info->lifecycle.copy == lifecycle->copy",
                "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/world.c"
                ,0x176);
    if ((EcsComponent)(local_30->lifecycle).copy != component_ptr[2]) {
      __assert_fail("c_info->lifecycle.copy == lifecycle->copy",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/world.c"
                    ,0x176,
                    "void ecs_set_component_actions_w_entity(ecs_world_t *, ecs_entity_t, EcsComponentLifecycle *)"
                   );
    }
    _ecs_assert((EcsComponent)(local_30->lifecycle).move == component_ptr[3],0x31,(char *)0x0,
                "c_info->lifecycle.move == lifecycle->move",
                "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/world.c"
                ,0x178);
    if ((EcsComponent)(local_30->lifecycle).move != component_ptr[3]) {
      __assert_fail("c_info->lifecycle.move == lifecycle->move",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/world.c"
                    ,0x178,
                    "void ecs_set_component_actions_w_entity(ecs_world_t *, ecs_entity_t, EcsComponentLifecycle *)"
                   );
    }
  }
  return;
}

Assistant:

void ecs_set_component_actions_w_entity(
    ecs_world_t *world,
    ecs_entity_t component,
    EcsComponentLifecycle *lifecycle)
{
#ifndef NDEBUG
    const EcsComponent *component_ptr = ecs_get(world, component, EcsComponent);

    /* Cannot register lifecycle actions for things that aren't a component */
    ecs_assert(component_ptr != NULL, ECS_INVALID_PARAMETER, NULL);

    /* Cannot register lifecycle actions for components with size 0 */
    ecs_assert(component_ptr->size != 0, ECS_INVALID_PARAMETER, NULL);
#endif

    ecs_c_info_t *c_info = ecs_get_or_create_c_info(world, component);
    ecs_assert(c_info != NULL, ECS_INTERNAL_ERROR, NULL);

    if (c_info->lifecycle_set) {
        ecs_assert(c_info->component == component, ECS_INTERNAL_ERROR, NULL);
        ecs_assert(c_info->lifecycle.ctor == lifecycle->ctor, 
            ECS_INCONSISTENT_COMPONENT_ACTION, NULL);
        ecs_assert(c_info->lifecycle.dtor == lifecycle->dtor, 
            ECS_INCONSISTENT_COMPONENT_ACTION, NULL);
        ecs_assert(c_info->lifecycle.copy == lifecycle->copy, 
            ECS_INCONSISTENT_COMPONENT_ACTION, NULL);
        ecs_assert(c_info->lifecycle.move == lifecycle->move, 
            ECS_INCONSISTENT_COMPONENT_ACTION, NULL);
    } else {
        c_info->component = component;
        c_info->lifecycle = *lifecycle;
        c_info->lifecycle_set = true;

        /* If no constructor is set, invoking any of the other lifecycle actions 
         * is not safe as they will potentially access uninitialized memory. For 
         * ease of use, if no constructor is specified, set a default one that 
         * initializes the component to 0. */
        if (!lifecycle->ctor && (lifecycle->dtor || lifecycle->copy || lifecycle->move)) {
            c_info->lifecycle.ctor = ctor_init_zero;   
        }

        ecs_notify_tables(world, &(ecs_table_event_t) {
            .kind = EcsTableComponentInfo,
            .component = component
        });
    }
}